

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_rmro(ASMState *as,x86Op xo,Reg rr,Reg rb,int32_t ofs)

{
  MCode *pMVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  x86Mode mode;
  MCode *p;
  int32_t ofs_local;
  Reg rb_local;
  Reg rr_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_20;
  byte *local_8;
  
  pMVar1 = as->mcp;
  if ((rb & 0x80) == 0) {
    if ((ofs == 0) && ((rb & 7) != 5)) {
      mode._0_1_ = XM_OFS0;
      p = pMVar1;
    }
    else if (ofs == (char)(MCode)ofs) {
      p = pMVar1 + -1;
      pMVar1[-1] = (MCode)ofs;
      mode._0_1_ = XM_OFS8;
    }
    else {
      p = pMVar1 + -4;
      *(int32_t *)p = ofs;
      mode._0_1_ = XM_OFS32;
    }
    rb_local = rb;
    if ((rb & 7) == 4) {
      p[-1] = '$';
      p = p + -1;
    }
  }
  else {
    *(int32_t *)(pMVar1 + -4) = ofs;
    pMVar1[-5] = '%';
    rb_local = 4;
    mode._0_1_ = XM_OFS0;
    p = pMVar1 + -5;
  }
  p[-1] = (undefined1)mode + (char)((rr & 7) << 3) + ((byte)rb_local & 7);
  iVar2 = (int)(char)xo;
  if (iVar2 == -0x3c) {
    *(x86Op *)(p + -5) = ((rr >> 1 & 4) + (rb_local >> 3 & 1)) * 0x2000 ^ xo;
    local_8 = p + -5;
  }
  else {
    *(x86Op *)(p + -5) = xo;
    pbVar4 = p + iVar2;
    iVar3 = (rr >> 1 & 0x104) + 0x40 + (rb_local >> 3 & 1);
    local_20 = pbVar4;
    if (iVar3 != 0x40) {
      rex._0_1_ = (byte)(rr >> 0x10) | (byte)iVar3;
      if (iVar2 == -4) {
        *pbVar4 = (byte)rex;
        rex._0_1_ = (byte)(xo >> 8);
      }
      else if ((xo & 0xffffff) == 0x6600fd) {
        *pbVar4 = (byte)rex;
        rex._0_1_ = 0x66;
      }
      local_20 = pbVar4 + -1;
      pbVar4[-1] = (byte)rex;
    }
    local_8 = local_20;
  }
  as->mcp = local_8;
  return;
}

Assistant:

static void emit_rmro(ASMState *as, x86Op xo, Reg rr, Reg rb, int32_t ofs)
{
  MCode *p = as->mcp;
  x86Mode mode;
  if (ra_hasreg(rb)) {
    if (LJ_GC64 && rb == RID_RIP) {
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = ofs;
    } else if (ofs == 0 && (rb&7) != RID_EBP) {
      mode = XM_OFS0;
    } else if (checki8(ofs)) {
      *--p = (MCode)ofs;
      mode = XM_OFS8;
    } else {
      p -= 4;
      *(int32_t *)p = ofs;
      mode = XM_OFS32;
    }
    if ((rb&7) == RID_ESP)
      *--p = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
  } else {
    *(int32_t *)(p-4) = ofs;
#if LJ_64
    p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
    p -= 5;
    rb = RID_ESP;
#else
    p -= 4;
    rb = RID_EBP;
#endif
    mode = XM_OFS0;
  }
  as->mcp = emit_opm(xo, mode, rr, rb, p, 0);
}